

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::pushScope
          (SemanticAnalyzerRun *this,bool newFn,
          vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *itemsToDeclare)

{
  undefined8 token;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<Token> local_a8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  optional<VariableDefinition> find;
  shared_ptr<Token> *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *__range1;
  shared_ptr<Scope> newScope;
  vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *itemsToDeclare_local;
  SemanticAnalyzerRun *pSStack_10;
  bool newFn_local;
  SemanticAnalyzerRun *this_local;
  
  newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)itemsToDeclare;
  itemsToDeclare_local._7_1_ = newFn;
  pSStack_10 = this;
  std::make_shared<Scope,bool&,std::shared_ptr<Scope>&>
            ((bool *)&__range1,(shared_ptr<Scope> *)((long)&itemsToDeclare_local + 7));
  std::shared_ptr<Scope>::operator=(&this->currentScope,(shared_ptr<Scope> *)&__range1);
  this_00 = newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  __end1 = std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::begin
                     ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                      newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi);
  item = (shared_ptr<Token> *)
         std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::end
                   ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                    this_00._M_pi);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<Token>_*,_std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>_>
                                *)&item);
    if (!bVar1) break;
    find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
    super__Optional_payload<VariableDefinition,_true,_false,_false>.
    super__Optional_payload_base<VariableDefinition>._24_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<Token>_*,_std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>_>
         ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->currentScope);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                        super__Optional_payload<VariableDefinition,_true,_false,_false>.
                        super__Optional_payload_base<VariableDefinition>._24_8_);
    Scope::findLocally((optional<VariableDefinition> *)local_70,peVar2,&peVar3->value,false);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_70);
    token = find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
            super__Optional_payload<VariableDefinition,_true,_false,_false>.
            super__Optional_payload_base<VariableDefinition>._24_8_;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Duplicate identifier found within the same scope.",&local_91);
      reportError(this,(shared_ptr<Token> *)token,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    else {
      peVar2 = std::__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->currentScope);
      peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                          super__Optional_payload<VariableDefinition,_true,_false,_false>.
                          super__Optional_payload_base<VariableDefinition>._24_8_);
      std::shared_ptr<Token>::shared_ptr
                (&local_a8,
                 (shared_ptr<Token> *)
                 find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                 super__Optional_payload<VariableDefinition,_true,_false,_false>.
                 super__Optional_payload_base<VariableDefinition>._24_8_);
      Scope::define(peVar2,&peVar3->value,&local_a8,true);
      std::shared_ptr<Token>::~shared_ptr(&local_a8);
    }
    std::optional<VariableDefinition>::~optional((optional<VariableDefinition> *)local_70);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Token>_*,_std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<Scope>::~shared_ptr((shared_ptr<Scope> *)&__range1);
  return;
}

Assistant:

void pushScope(bool newFn, const std::vector<std::shared_ptr<Token>>& itemsToDeclare) noexcept {
    auto newScope = std::make_shared<Scope>(newFn, this->currentScope);
    this->currentScope = newScope;

    for (auto& item : itemsToDeclare) {
      auto find = this->currentScope->findLocally(item->value, false);

      if (find) {
        this->reportError(item, "Duplicate identifier found within the same scope.");

      } else {
        this->currentScope->define(item->value, item, true);
      }
    }
  }